

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  key_type **pppcVar1;
  ulong uVar2;
  uint __val;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  detail *this;
  char *pcVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  PyObject *pPVar13;
  handle *handle;
  handle *handle_00;
  uint __len;
  string *in_RDI;
  undefined8 uVar14;
  PyTypeObject *pPVar15;
  size_type __dnew;
  string __str;
  error_scope scope;
  handle local_1a8;
  size_type local_1a0;
  PyObject local_198;
  string local_188;
  accessor<pybind11::detail::accessor_policies::str_attr> local_168;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  ulong *local_108;
  handle *local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  error_scope local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  string *local_a8;
  PyObject *local_a0;
  size_type local_98;
  PyObject local_90;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  PyObject *local_60;
  size_type local_58;
  PyObject local_50;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar6 = PyErr_Occurred();
  if (lVar6 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_188._M_dataplus._M_p = (pointer)0x1f;
    pcVar7 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_188);
    (in_RDI->_M_dataplus)._M_p = pcVar7;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    builtin_strncpy(pcVar7,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(&local_c8,&local_c8.value,&local_c8.trace);
    local_b0 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_b0;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_a8 = in_RDI;
    if (local_c8.type != (PyObject *)0x0) {
      local_168.obj.m_ptr = local_c8.type;
      local_168.key = "__name__";
      local_168.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      this = (detail *)
             accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_168);
      load_type<std::__cxx11::string>
                ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,this,handle);
      local_1a8.m_ptr = (PyObject *)local_188._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == &local_188.field_2) {
        local_198.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
        local_1a8.m_ptr = &local_198;
      }
      local_198.ob_refcnt = local_188.field_2._M_allocated_capacity;
      local_1a0 = local_188._M_string_length;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1a8.m_ptr);
      if (local_1a8.m_ptr != &local_198) {
        operator_delete(local_1a8.m_ptr,local_198.ob_refcnt + 1);
      }
      object::~object(&local_168.cache);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_c8.value != (PyObject *)0x0) {
      local_1a8.m_ptr = (PyObject *)PyObject_Str();
      str::operator_cast_to_string(&local_188,(str *)&local_1a8);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      object::~object((object *)&local_1a8);
    }
    PyErr_NormalizeException(&local_c8,&local_c8.value,&local_c8.trace);
    if ((local_c8.trace != (PyObject *)0x0) &&
       (PyException_SetTraceback(local_c8.value), local_c8.trace != (PyObject *)0x0)) {
      do {
        pPVar13 = local_c8.trace;
        local_c8.trace = (PyObject *)pPVar13[1].ob_refcnt;
      } while (local_c8.trace != (PyObject *)0x0);
      pPVar15 = pPVar13[1].ob_type;
      std::__cxx11::string::append((char *)in_RDI);
      if (pPVar15 != (PyTypeObject *)0x0) {
        do {
          uVar4 = PyFrame_GetLineNumber(pPVar15);
          local_38 = *(undefined8 *)(pPVar15->tp_basicsize + 0x68);
          load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,
                     (detail *)&local_38,handle_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == &local_188.field_2) {
            local_90.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
            local_a0 = &local_90;
          }
          else {
            local_a0 = (PyObject *)local_188._M_dataplus._M_p;
          }
          local_90.ob_refcnt = local_188.field_2._M_allocated_capacity;
          local_98 = local_188._M_string_length;
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x143fac);
          plVar10 = plVar8 + 2;
          if ((long *)*plVar8 == plVar10) {
            local_70 = *plVar10;
            lStack_68 = plVar8[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar10;
            local_80 = (long *)*plVar8;
          }
          local_78 = plVar8[1];
          *plVar8 = (long)plVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
          puVar11 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar11) {
            local_138 = *puVar11;
            lStack_130 = plVar8[3];
            local_148 = &local_138;
          }
          else {
            local_138 = *puVar11;
            local_148 = (ulong *)*plVar8;
          }
          local_140 = plVar8[1];
          *plVar8 = (long)puVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          __val = -uVar4;
          if (0 < (int)uVar4) {
            __val = uVar4;
          }
          __len = 1;
          if (9 < __val) {
            uVar12 = (ulong)__val;
            uVar3 = 4;
            do {
              __len = uVar3;
              uVar5 = (uint)uVar12;
              if (uVar5 < 100) {
                __len = __len - 2;
                goto LAB_00117ad5;
              }
              if (uVar5 < 1000) {
                __len = __len - 1;
                goto LAB_00117ad5;
              }
              if (uVar5 < 10000) goto LAB_00117ad5;
              uVar12 = uVar12 / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar5);
            __len = __len + 1;
          }
LAB_00117ad5:
          local_e8 = local_d8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_e8,(char)__len - (char)((int)uVar4 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_e8),__len,__val);
          in_RDI = local_a8;
          uVar12 = 0xf;
          if (local_148 != &local_138) {
            uVar12 = local_138;
          }
          if (uVar12 < (ulong)(local_e0 + local_140)) {
            uVar12 = 0xf;
            if (local_e8 != local_d8) {
              uVar12 = local_d8[0];
            }
            if (uVar12 < (ulong)(local_e0 + local_140)) goto LAB_00117b83;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_148);
          }
          else {
LAB_00117b83:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_e8);
          }
          local_128 = &local_118;
          plVar8 = puVar9 + 2;
          if ((long *)*puVar9 == plVar8) {
            local_118 = *plVar8;
            uStack_110 = puVar9[3];
          }
          else {
            local_118 = *plVar8;
            local_128 = (long *)*puVar9;
          }
          local_120 = puVar9[1];
          *puVar9 = plVar8;
          puVar9[1] = 0;
          *(undefined1 *)plVar8 = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_108 = &local_f8;
          puVar11 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar11) {
            local_f8 = *puVar11;
            lStack_f0 = plVar8[3];
          }
          else {
            local_f8 = *puVar11;
            local_108 = (ulong *)*plVar8;
          }
          local_100 = (handle *)plVar8[1];
          *plVar8 = (long)puVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          local_40 = *(undefined8 *)(pPVar15->tp_basicsize + 0x70);
          load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,
                     (detail *)&local_40,local_100);
          local_60 = (PyObject *)local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == &local_188.field_2) {
            local_50.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
            local_60 = &local_50;
          }
          local_50.ob_refcnt = local_188.field_2._M_allocated_capacity;
          local_58 = local_188._M_string_length;
          uVar12 = 0xf;
          if (local_108 != &local_f8) {
            uVar12 = local_f8;
          }
          uVar2 = (long)&local_100->m_ptr + local_188._M_string_length;
          if (uVar12 < uVar2) {
            uVar14 = 0xf;
            if (local_60 != &local_50) {
              uVar14 = local_188.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < uVar2) goto LAB_00117d10;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_108);
          }
          else {
LAB_00117d10:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_60);
          }
          local_168._0_8_ = &local_168.key;
          pppcVar1 = (key_type **)(puVar9 + 2);
          if ((key_type **)*puVar9 == pppcVar1) {
            local_168.key = (key_type)*pppcVar1;
            local_168.cache.super_handle.m_ptr = (handle)puVar9[3];
          }
          else {
            local_168.key = (key_type)*pppcVar1;
            local_168._0_8_ = (key_type **)*puVar9;
          }
          local_168.obj.m_ptr = (PyObject *)puVar9[1];
          *puVar9 = pppcVar1;
          puVar9[1] = 0;
          *(undefined1 *)pppcVar1 = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_1a8.m_ptr = &local_198;
          pPVar13 = (PyObject *)(plVar8 + 2);
          if ((PyObject *)*plVar8 == pPVar13) {
            local_198.ob_refcnt = pPVar13->ob_refcnt;
            local_198.ob_type = (PyTypeObject *)plVar8[3];
          }
          else {
            local_198.ob_refcnt = pPVar13->ob_refcnt;
            local_1a8.m_ptr = (PyObject *)*plVar8;
          }
          local_1a0 = plVar8[1];
          *plVar8 = (long)pPVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1a8.m_ptr);
          if (local_1a8.m_ptr != &local_198) {
            operator_delete(local_1a8.m_ptr,local_198.ob_refcnt + 1);
          }
          if ((key_type *)local_168._0_8_ != &local_168.key) {
            operator_delete((void *)local_168._0_8_,(long)local_168.key + 1);
          }
          if (local_60 != &local_50) {
            operator_delete(local_60,local_50.ob_refcnt + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90.ob_refcnt + 1);
          }
          pPVar15 = (PyTypeObject *)pPVar15->tp_name;
        } while (pPVar15 != (PyTypeObject *)0x0);
      }
    }
    error_scope::~error_scope(&local_c8);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}